

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeEditor.cxx
# Opt level: O2

void __thiscall CodeEditor::~CodeEditor(CodeEditor *this)

{
  ~CodeEditor(this);
  operator_delete(this,0x1c0);
  return;
}

Assistant:

CodeEditor::~CodeEditor() {
  Fl_Text_Buffer *buf = mStyleBuffer;
  mStyleBuffer = 0;
  delete buf;

  buf = mBuffer;
  buffer(0);
  delete buf;
}